

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O0

void testingHelp(void)

{
  printf(
        "Usage:\ttest [FLAG]... [OPTION]\n\nFlags:\t\'-map\' tests file parsing(defaults to cwd, optional absolute path as arg)\n\t\'-unit\' tests unit creation and deletion\n"
        );
  return;
}

Assistant:

void testingHelp() {
    printf(
        "Usage:\ttest [FLAG]... [OPTION]\n\n"
            "Flags:"
            "\t'-map' tests file parsing"
            "(defaults to cwd, optional absolute path as arg)\n"
            "\t'-unit' tests unit creation and deletion\n"
    );
}